

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL Js::JavascriptProxy::SetIntegrityLevel
               (IntegrityLevel integrityLevel,RecyclableObject *obj,ScriptContext *scriptContext)

{
  PropertyId propertyId;
  code *pcVar1;
  PropertyRecord *pPVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptArray *pJVar7;
  Var pvVar8;
  undefined4 extraout_var_00;
  PropertyDescriptor *descriptor;
  uint i;
  uint uVar9;
  undefined1 local_110 [8];
  PropertyDescriptor dataDescriptor;
  PropertyDescriptor accessorDescriptor;
  PropertyDescriptor propertyDescriptor;
  PropertyDescriptor propertyDescriptor_1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  undefined4 extraout_var;
  
  propertyRecord = (PropertyRecord *)scriptContext;
  bVar3 = VarIsImpl<Js::JavascriptProxy>(obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x531,"(VarIs<JavascriptProxy>(obj))","VarIs<JavascriptProxy>(obj)"
                               );
    if (!bVar3) goto LAB_00ba8215;
    *puVar6 = 0;
  }
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x35])(obj);
  if (iVar4 == 0) {
    BVar5 = 0;
  }
  else {
    pJVar7 = JavascriptOperators::GetOwnPropertyKeys(obj,(ScriptContext *)propertyRecord);
    if (integrityLevel == IntegrityLevel_sealed) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&accessorDescriptor.Configurable)
      ;
      PropertyDescriptor::SetConfigurable
                ((PropertyDescriptor *)&accessorDescriptor.Configurable,false);
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (uVar9 = 0; uVar9 < (pJVar7->super_ArrayObject).length; uVar9 = uVar9 + 1) {
        iVar4 = (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pJVar7,(ulong)uVar9);
        pvVar8 = (Var)CONCAT44(extraout_var,iVar4);
        bVar3 = VarIs<Js::JavascriptSymbol>(pvVar8);
        if (!bVar3) {
          bVar3 = VarIs<Js::JavascriptString>(pvVar8);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x546,
                                        "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                        ,
                                        "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                       );
            if (!bVar3) goto LAB_00ba8215;
            *puVar6 = 0;
          }
        }
        pPVar2 = propertyRecord;
        JavascriptConversion::ToPropertyKey
                  (pvVar8,(ScriptContext *)propertyRecord,&local_40,(PropertyString **)0x0);
        JavascriptObject::DefineOwnPropertyHelper
                  (obj,local_40->pid,(PropertyDescriptor *)&accessorDescriptor.Configurable,
                   (ScriptContext *)pPVar2,true);
      }
    }
    else {
      if (integrityLevel == IntegrityLevel_frozen) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x559,
                                    "(integrityLevel == IntegrityLevel::IntegrityLevel_frozen)",
                                    "integrityLevel == IntegrityLevel::IntegrityLevel_frozen");
        if (!bVar3) {
LAB_00ba8215:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&accessorDescriptor.Configurable)
      ;
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_110);
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&dataDescriptor.Configurable);
      PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_110,false);
      PropertyDescriptor::SetWritable((PropertyDescriptor *)local_110,false);
      PropertyDescriptor::SetConfigurable((PropertyDescriptor *)&dataDescriptor.Configurable,false);
      pPVar2 = propertyRecord;
      for (uVar9 = 0; uVar9 < (pJVar7->super_ArrayObject).length; uVar9 = uVar9 + 1) {
        iVar4 = (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pJVar7,(ulong)uVar9);
        pvVar8 = (Var)CONCAT44(extraout_var_00,iVar4);
        bVar3 = VarIs<Js::JavascriptSymbol>(pvVar8);
        if (!bVar3) {
          bVar3 = VarIs<Js::JavascriptString>(pvVar8);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x562,
                                        "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                        ,
                                        "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                       );
            if (!bVar3) goto LAB_00ba8215;
            *puVar6 = 0;
          }
        }
        JavascriptConversion::ToPropertyKey
                  (pvVar8,(ScriptContext *)pPVar2,&local_40,(PropertyString **)0x0);
        propertyId = local_40->pid;
        PropertyDescriptor::PropertyDescriptor
                  ((PropertyDescriptor *)&propertyDescriptor.Configurable);
        BVar5 = JavascriptObject::GetOwnPropertyDescriptorHelper
                          (obj,propertyId,(ScriptContext *)pPVar2,
                           (PropertyDescriptor *)&propertyDescriptor.Configurable);
        if ((BVar5 != 0) &&
           ((descriptor = (PropertyDescriptor *)local_110,
            propertyDescriptor_1.originalVar.ptr._3_1_ != '\0' ||
            (char)propertyDescriptor_1.originalVar.ptr != '\0' ||
            (descriptor = (PropertyDescriptor *)&dataDescriptor.Configurable,
            propertyDescriptor_1.originalVar.ptr._5_1_ != '\0' ||
            propertyDescriptor_1.originalVar.ptr._4_1_ != '\0')))) {
          JavascriptObject::DefineOwnPropertyHelper
                    (obj,local_40->pid,descriptor,(ScriptContext *)propertyRecord,true);
        }
      }
    }
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL JavascriptProxy::SetIntegrityLevel(IntegrityLevel integrityLevel, RecyclableObject* obj, ScriptContext* scriptContext)
    {
        //1. Assert: Type(O) is Object.
        //2. Assert : level is either "sealed" or "frozen".
        //3. Let status be O.[[PreventExtensions]]().
        //4. ReturnIfAbrupt(status).
        //5. If status is false, return false.

        // at this time this is called from proxy only; when we extend this to other objects, we need to handle the other codepath.
        Assert(VarIs<JavascriptProxy>(obj));
        if (obj->PreventExtensions() == FALSE)
            return FALSE;

        //6. Let keys be O.[[OwnPropertyKeys]]().
        //7. ReturnIfAbrupt(keys).
        JavascriptArray* resultArray = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);

        const PropertyRecord* propertyRecord;
        if (integrityLevel == IntegrityLevel::IntegrityLevel_sealed)
        {
            //8. If level is "sealed", then
                //a. Repeat for each element k of keys,
                    //i. Let status be DefinePropertyOrThrow(O, k, PropertyDescriptor{ [[Configurable]]: false }).
                    //ii. ReturnIfAbrupt(status).
            PropertyDescriptor propertyDescriptor;
            propertyDescriptor.SetConfigurable(false);
            Var itemVar;
            for (uint i = 0; i < resultArray->GetLength(); i++)
            {
                itemVar = resultArray->DirectGetItem(i);
                AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
                JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
                PropertyId propertyId = propertyRecord->GetPropertyId();
                JavascriptObject::DefineOwnPropertyHelper(obj, propertyId, propertyDescriptor, scriptContext);
            }
        }
        else
        {
            //9.Else level is "frozen",
            //  a.Repeat for each element k of keys,
            //      i. Let currentDesc be O.[[GetOwnProperty]](k).
            //      ii. ReturnIfAbrupt(currentDesc).
            //      iii. If currentDesc is not undefined, then
            //          1. If IsAccessorDescriptor(currentDesc) is true, then
            //              a. Let desc be the PropertyDescriptor{[[Configurable]]: false}.
            //          2.Else,
            //              a. Let desc be the PropertyDescriptor { [[Configurable]]: false, [[Writable]]: false }.
            //          3. Let status be DefinePropertyOrThrow(O, k, desc).
            //          4. ReturnIfAbrupt(status).
            Assert(integrityLevel == IntegrityLevel::IntegrityLevel_frozen);
            PropertyDescriptor current, dataDescriptor, accessorDescriptor;
            dataDescriptor.SetConfigurable(false);
            dataDescriptor.SetWritable(false);
            accessorDescriptor.SetConfigurable(false);
            Var itemVar;
            for (uint i = 0; i < resultArray->GetLength(); i++)
            {
                itemVar = resultArray->DirectGetItem(i);
                AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
                JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
                PropertyId propertyId = propertyRecord->GetPropertyId();
                PropertyDescriptor propertyDescriptor;
                if (JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propertyId, scriptContext, propertyDescriptor))
                {
                    if (propertyDescriptor.IsDataDescriptor())
                    {
                        JavascriptObject::DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), dataDescriptor, scriptContext);
                    }
                    else if (propertyDescriptor.IsAccessorDescriptor())
                    {
                        JavascriptObject::DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), accessorDescriptor, scriptContext);
                    }
                }
            }
        }

        // 10. Return true
        return TRUE;
    }